

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  undefined8 *puVar1;
  size_t sVar2;
  _func_int_st_ptls_message_emitter_t_ptr *p_Var3;
  ptls_buffer_t *ppVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  _func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
  *p_Var12;
  _func_void_void_ptr_size_t *p_Var13;
  ptls_buffer_t *ppVar14;
  _func_int_st_ptls_update_traffic_key_t_ptr_ptls_t_ptr_int_size_t_void_ptr *p_Var15;
  st_ptls_update_traffic_key_t *psVar16;
  char *__s;
  size_t sVar17;
  ptls_iovec_t tbs;
  ptls_iovec_t ikm;
  uint8_t desired_type;
  int iVar18;
  void *pvVar19;
  size_t __n;
  ptls_key_schedule_t *ppVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  size_t *psVar24;
  undefined8 uStackY_10d0;
  uint8_t *in_stack_ffffffffffffef38;
  ptls_key_schedule_t *in_stack_ffffffffffffef40;
  ptls_buffer_t *in_stack_ffffffffffffef48;
  ptls_key_schedule_t *in_stack_ffffffffffffef50;
  uint8_t *in_stack_ffffffffffffef58;
  uint8_t *in_stack_ffffffffffffef60;
  ptls_message_emitter_t *in_stack_ffffffffffffef68;
  ptls_t *in_stack_ffffffffffffef70;
  ptls_iovec_t *in_stack_ffffffffffffef78;
  ptls_key_exchange_algorithm_t **in_stack_ffffffffffffef80;
  ptls_key_exchange_algorithm_t **in_stack_ffffffffffffef88;
  uint8_t *in_stack_ffffffffffffef90;
  ptls_key_exchange_algorithm_t *in_stack_ffffffffffffef98;
  st_ptls_client_hello_t *in_stack_ffffffffffffefa0;
  ptls_t *in_stack_ffffffffffffefa8;
  ptls_iovec_t *in_stack_ffffffffffffefb0;
  ptls_context_t *in_stack_ffffffffffffefb8;
  uint8_t *in_stack_ffffffffffffefc0;
  size_t in_stack_ffffffffffffefc8;
  char *in_stack_ffffffffffffefe8;
  ptls_cipher_suite_t **in_stack_ffffffffffffeff0;
  ptls_cipher_suite_t *in_stack_ffffffffffffeff8;
  ptls_message_emitter_t *local_f38;
  ptls_message_emitter_t *local_e70;
  st_ptls_key_exchange_algorithm_t *local_e08;
  size_t body_size_37;
  size_t body_size_38;
  size_t body_size_39;
  size_t body_start_39;
  size_t capacity_39;
  uint16_t _v_33;
  size_t body_start_38;
  size_t capacity_38;
  ptls_buffer_t *sendbuf_3;
  size_t body_start_37;
  size_t capacity_37;
  size_t mess_start_5;
  ptls_key_schedule_t *_key_sched_5;
  ptls_buffer_t *_buf_5;
  ptls_message_emitter_t *_emitter_5;
  size_t body_size_28;
  size_t body_size_29;
  size_t body_size_36;
  size_t body_start_36;
  size_t capacity_36;
  uint16_t _v_32;
  size_t body_size_33;
  size_t body_size_34;
  size_t body_size_35;
  size_t body_start_35;
  size_t capacity_35;
  size_t body_start_34;
  size_t capacity_34;
  size_t body_start_33;
  size_t capacity_33;
  uint16_t _v_31;
  size_t body_size_32;
  size_t body_start_32;
  size_t capacity_32;
  uint16_t _v_30;
  size_t body_size_31;
  size_t body_start_31;
  size_t capacity_31;
  uint16_t _v_29;
  size_t body_size_30;
  uint8_t response_type;
  size_t body_start_30;
  size_t capacity_30;
  uint16_t _v_28;
  size_t body_start_29;
  size_t capacity_29;
  ptls_buffer_t *sendbuf_2;
  size_t body_start_28;
  size_t capacity_28;
  size_t mess_start_4;
  ptls_key_schedule_t *_key_sched_4;
  ptls_buffer_t *_buf_4;
  ptls_message_emitter_t *_emitter_4;
  size_t body_size_21;
  size_t body_size_23;
  size_t body_size_27;
  uint8_t *puStack_ba8;
  uint16_t _v_27;
  size_t body_start_27;
  size_t capacity_27;
  ptls_t *ppStack_b90;
  uint16_t _v_26;
  size_t body_size_25;
  size_t body_size_26;
  size_t body_start_26;
  size_t capacity_26;
  uint16_t _v_25;
  size_t body_start_25;
  size_t capacity_25;
  uint16_t _v_24;
  ptls_buffer_t *sendbuf_1;
  size_t body_size_24;
  uint16_t _v_23;
  size_t body_start_24;
  size_t capacity_24;
  uint16_t _v_22;
  size_t body_start_23;
  size_t capacity_23;
  uint16_t _v_21;
  size_t body_size_22;
  size_t body_start_22;
  size_t capacity_22;
  uint16_t _v_20;
  size_t body_start_21;
  size_t capacity_21;
  size_t mess_start_3;
  ptls_key_schedule_t *_key_sched_3;
  ptls_buffer_t *_buf_3;
  ptls_message_emitter_t *_emitter_3;
  ptls_iovec_t *selected;
  size_t body_size_16;
  size_t body_size_18;
  size_t body_size_20;
  uint16_t _v_19;
  size_t body_start_20;
  size_t capacity_20;
  uint16_t _v_18;
  ptls_key_exchange_algorithm_t *_negotiated_group_2;
  size_t body_size_19;
  uint16_t _v_17;
  size_t body_start_19;
  size_t capacity_19;
  uint16_t _v_16;
  size_t body_start_18;
  size_t capacity_18;
  uint16_t _v_15;
  size_t body_size_17;
  size_t body_start_17;
  size_t capacity_17;
  uint16_t _v_14;
  size_t body_start_16;
  size_t capacity_16;
  size_t mess_start_2;
  ptls_key_schedule_t *_key_sched_2;
  ptls_buffer_t *_buf_2;
  ptls_message_emitter_t *_emitter_2;
  size_t body_size_6;
  size_t body_size_8;
  size_t body_size_11;
  size_t body_size_12;
  size_t body_size_15;
  size_t sz_1;
  size_t body_start_15;
  size_t capacity_15;
  size_t tbs_len;
  size_t body_size_13;
  size_t body_size_14;
  size_t sz;
  size_t body_start_14;
  size_t capacity_14;
  size_t body_start_13;
  size_t capacity_13;
  size_t tbs_start;
  size_t body_start_12;
  size_t capacity_12;
  size_t body_start_11;
  size_t capacity_11;
  uint16_t _v_13;
  ptls_buffer_t *sendbuf;
  size_t body_size_10;
  uint16_t _v_12;
  size_t body_start_10;
  size_t capacity_10;
  uint16_t _v_11;
  ptls_key_exchange_algorithm_t *_negotiated_group_1;
  size_t body_size_9;
  uint16_t _v_10;
  size_t body_start_9;
  size_t capacity_9;
  uint16_t _v_9;
  size_t body_start_8;
  size_t capacity_8;
  uint16_t _v_8;
  size_t body_size_7;
  size_t body_start_7;
  size_t capacity_7;
  uint16_t _v_7;
  size_t body_start_6;
  size_t capacity_6;
  size_t mess_start_1;
  ptls_key_schedule_t *_key_sched_1;
  ptls_buffer_t *_buf_1;
  ptls_message_emitter_t *_emitter_1;
  ptls_key_exchange_algorithm_t *negotiated_group;
  size_t body_size;
  size_t body_size_2;
  size_t body_size_5;
  size_t body_start_5;
  size_t capacity_5;
  uint16_t _v_6;
  size_t body_size_4;
  uint16_t _v_5;
  size_t body_start_4;
  size_t capacity_4;
  uint16_t _v_4;
  ptls_key_exchange_algorithm_t *_negotiated_group;
  size_t body_size_3;
  uint16_t _v_3;
  size_t body_start_3;
  size_t capacity_3;
  uint16_t _v_2;
  size_t body_start_2;
  size_t capacity_2;
  uint16_t _v_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint16_t _v;
  size_t body_start;
  size_t capacity;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  size_t hrr_start;
  uint8_t *sig;
  size_t sigsize;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint8_t *end;
  uint8_t *src;
  ptls_cipher_suite_t *cs;
  size_t l;
  ptls_on_client_hello_parameters_t params_1;
  void *pvStack_618;
  int is_esni;
  ptls_iovec_t server_name;
  ptls_on_client_hello_parameters_t params;
  undefined1 auStack_230 [420];
  int local_8c;
  uint local_88;
  int ret;
  int is_second_flight;
  int accept_early_data;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  size_t psk_index;
  st_ptls_key_exchange_algorithm_t *psStack_50;
  anon_enum_32 mode;
  anon_struct_24_2_cc7b932a key_share;
  st_ptls_client_hello_t *ch;
  ptls_handshake_properties_t *properties_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  puVar22 = message.base;
  uStackY_10d0 = 0x11f59f;
  memset(&stack0xffffffffffffffb0,0,0x18);
  uStackY_10d0 = 0x11f5b7;
  memset(&ecdh_secret.len,0,0x10);
  uStackY_10d0 = 0x11f5c7;
  memset(&is_second_flight,0,0x10);
  ret = 0;
  local_88 = (uint)(tls->state == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO);
  uStackY_10d0 = 0x11f5eb;
  pvVar19 = malloc(0x500);
  key_share.peer_key.len = (size_t)pvVar19;
  if (pvVar19 == (void *)0x0) {
    local_8c = 0x201;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  uStackY_10d0 = 0x11f622;
  memset(&params.field_0x70,0,0x500);
  uStackY_10d0 = 0x11f641;
  memcpy(auStack_230,&DAT_00161bb8,0x198);
  uStackY_10d0 = 0x11f659;
  memcpy(pvVar19,&params.field_0x70,0x500);
  uStackY_10d0 = 0x11f67a;
  local_8c = decode_client_hello(ppStack_b90,
                                 (st_ptls_client_hello_t *)
                                 CONCAT26(capacity_27._6_2_,
                                          CONCAT15(capacity_27._5_1_,
                                                   CONCAT14(capacity_27._4_1_,
                                                            (undefined4)capacity_27))),
                                 (uint8_t *)body_start_27,puStack_ba8,
                                 (ptls_handshake_properties_t *)
                                 CONCAT26(body_size_27._6_2_,
                                          CONCAT15(body_size_27._5_1_,
                                                   CONCAT14(body_size_27._4_1_,
                                                            (undefined4)body_size_27))));
  psVar24 = (size_t *)&stack0xffffffffffffef38;
  if (local_8c != 0) goto LAB_00125319;
  uStackY_10d0 = 0x11f697;
  iVar18 = is_supported_version(*(uint16_t *)(key_share.peer_key.len + 0x30));
  if (iVar18 == 0) {
    if ((local_88 == 0) && (tls->ctx->on_client_hello != (ptls_on_client_hello_t *)0x0)) {
      server_name.len = *(size_t *)(key_share.peer_key.len + 0x90);
      params.server_name.base = *(uint8_t **)(key_share.peer_key.len + 0x98);
      params.raw_message.len = key_share.peer_key.len + 0xd8;
      params.negotiated_protocols.list = *(ptls_iovec_t **)(key_share.peer_key.len + 0x1d8);
      uStackY_10d0 = 0x11f72c;
      params.server_name.len = (size_t)puVar22;
      params.raw_message.base = (uint8_t *)message.len;
      memset(&params.negotiated_protocols.count,0,0x10);
      uStackY_10d0 = 0x11f743;
      memset(&params.signature_algorithms.count,0,0x10);
      uStackY_10d0 = 0x11f75a;
      memset(&params.certificate_compression_algorithms.count,0,0x10);
      uStackY_10d0 = 0x11f771;
      memset(&params.cipher_suites.count,0,0x10);
      params.server_certificate_types.count._0_1_ =
           (byte)params.server_certificate_types.count & 0xfc | 2;
      uStackY_10d0 = 0x11f7b7;
      local_8c = (*tls->ctx->on_client_hello->cb)
                           (tls->ctx->on_client_hello,tls,
                            (ptls_on_client_hello_parameters_t *)&server_name.len);
      psVar24 = (size_t *)&stack0xffffffffffffef38;
      if (local_8c != 0) goto LAB_00125319;
    }
    local_8c = 0x46;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  if (*(ushort *)key_share.peer_key.len < 0x301) {
    local_8c = 0x46;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  if ((*(long *)(key_share.peer_key.len + 0x28) != 1) ||
     (**(char **)(key_share.peer_key.len + 0x20) != '\0')) {
    local_8c = 0x2f;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  if ((*(long *)(key_share.peer_key.len + 0xa0) != 0) &&
     (*(long *)(key_share.peer_key.len + 0x58) == 0)) {
    local_8c = 0x2f;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  if (*(long *)(key_share.peer_key.len + 0x298) == 0) {
    if ((*(byte *)(key_share.peer_key.len + 0x34c) & 1) != 0) {
      local_8c = 0x2f;
      psVar24 = (size_t *)&stack0xffffffffffffef38;
      goto LAB_00125319;
    }
  }
  else if ((*(byte *)(key_share.peer_key.len + 0x34c) >> 1 & 1) == 0) {
    local_8c = 0x2f;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  if ((tls->ctx->field_0x70 & 1) != 0) {
    *(uint *)(key_share.peer_key.len + 0x348) =
         *(uint *)(key_share.peer_key.len + 0x348) & 0xfffffffe;
  }
  if (local_88 == 0) {
    puVar1 = *(undefined8 **)(key_share.peer_key.len + 8);
    *(undefined8 *)tls->client_random = *puVar1;
    *(undefined8 *)(tls->client_random + 8) = puVar1[1];
    *(undefined8 *)(tls->client_random + 0x10) = puVar1[2];
    *(undefined8 *)(tls->client_random + 0x18) = puVar1[3];
    uStackY_10d0 = 0x11f914;
    log_client_random(tls);
    if (*(long *)(key_share.peer_key.len + 0x18) != 0) {
      tls->field_0x160 = tls->field_0x160 & 0xfb | 4;
    }
    uStackY_10d0 = 0x11f948;
    memset(&stack0xfffffffffffff9e8,0,0x10);
    params_1._116_4_ = 0;
    if ((*(long *)(key_share.peer_key.len + 0xa0) == 0) ||
       (tls->ctx->esni == (ptls_esni_context_t **)0x0)) {
      if (*(long *)(key_share.peer_key.len + 0x90) != 0) {
        pvStack_618 = *(void **)(key_share.peer_key.len + 0x90);
        server_name.base = *(uint8_t **)(key_share.peer_key.len + 0x98);
      }
    }
    else {
      uStackY_10d0 = 0x11f998;
      local_8c = client_hello_decrypt_esni
                           (in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,
                            (ptls_esni_secret_t **)in_stack_ffffffffffffefa8,
                            in_stack_ffffffffffffefa0);
      psVar24 = (size_t *)&stack0xffffffffffffef38;
      if (local_8c != 0) goto LAB_00125319;
      if (tls->ctx->update_esni_key != (ptls_update_esni_key_t *)0x0) {
        uStackY_10d0 = 0x11fa0e;
        local_8c = (*tls->ctx->update_esni_key->cb)
                             (tls->ctx->update_esni_key,tls,tls->esni->secret,
                              *(ptls_hash_algorithm_t **)
                               (*(long *)(key_share.peer_key.len + 0xa0) + 0x10),
                              tls->esni->esni_contents_hash);
        psVar24 = (size_t *)&stack0xffffffffffffef38;
        if (local_8c != 0) goto LAB_00125319;
      }
      local_8c = 0;
      params_1._116_4_ = 1;
    }
    if (tls->ctx->on_client_hello == (ptls_on_client_hello_t *)0x0) {
      local_8c = 0;
    }
    else {
      l = (size_t)pvStack_618;
      params_1.server_name.base = server_name.base;
      params_1.raw_message.len = key_share.peer_key.len + 0xd8;
      params_1.negotiated_protocols.list = *(ptls_iovec_t **)(key_share.peer_key.len + 0x1d8);
      params_1.negotiated_protocols.count = key_share.peer_key.len + 0x68;
      params_1.signature_algorithms.list = *(uint16_t **)(key_share.peer_key.len + 0x88);
      params_1.signature_algorithms.count = key_share.peer_key.len + 0x1e0;
      params_1.certificate_compression_algorithms.list =
           *(uint16_t **)(key_share.peer_key.len + 0x200);
      params_1.certificate_compression_algorithms.count = key_share.peer_key.len + 0x208;
      params_1.cipher_suites.list = *(uint16_t **)(key_share.peer_key.len + 0x248);
      params_1.cipher_suites.count = key_share.peer_key.len + 0x350;
      params_1.server_certificate_types.list = *(uint8_t **)(key_share.peer_key.len + 0x358);
      params_1.server_certificate_types.count._0_1_ =
           (byte)params_1.server_certificate_types.count & 0xfc | params_1._116_1_;
      uStackY_10d0 = 0x11fb9e;
      params_1.server_name.len = (size_t)puVar22;
      params_1.raw_message.base = (uint8_t *)message.len;
      local_8c = (*tls->ctx->on_client_hello->cb)
                           (tls->ctx->on_client_hello,tls,(ptls_on_client_hello_parameters_t *)&l);
    }
    if (params_1._116_4_ != 0) {
      uStackY_10d0 = 0x11fbc5;
      free(pvStack_618);
    }
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    if (local_8c != 0) goto LAB_00125319;
    desired_type = '\0';
    if (((byte)tls->ctx->field_0x70 >> 5 & 1) != 0) {
      desired_type = '\x02';
    }
    uStackY_10d0 = 0x11fc10;
    iVar18 = certificate_type_exists
                       ((uint8_t *)(key_share.peer_key.len + 0x350),
                        *(size_t *)(key_share.peer_key.len + 0x358),desired_type);
    if (iVar18 == 0) {
      local_8c = 0x2b;
      psVar24 = (size_t *)&stack0xffffffffffffef38;
      goto LAB_00125319;
    }
    goto LAB_0011fcf4;
  }
  if ((*(byte *)(key_share.peer_key.len + 0x34c) & 1) != 0) {
    local_8c = 0x32;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  uStackY_10d0 = 0x11fc6d;
  iVar18 = (*ptls_mem_equal)(tls->client_random,*(void **)(key_share.peer_key.len + 8),0x20);
  if (iVar18 == 0) {
    local_8c = 0x28;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  if (tls->server_name != (char *)0x0) {
    uStackY_10d0 = 0x11fc9f;
    __n = strlen(tls->server_name);
    if (*(size_t *)(key_share.peer_key.len + 0x98) == __n) {
      uStackY_10d0 = 0x11fcdc;
      iVar18 = memcmp(*(void **)(key_share.peer_key.len + 0x90),tls->server_name,__n);
      if (iVar18 == 0) goto LAB_0011fcf4;
    }
    local_8c = 0x28;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
LAB_0011fcf4:
  uStackY_10d0 = 0x11fd36;
  local_8c = select_cipher((ptls_cipher_suite_t **)in_stack_ffffffffffffef70,
                           (ptls_cipher_suite_t **)in_stack_ffffffffffffef68,
                           in_stack_ffffffffffffef60,in_stack_ffffffffffffef58,
                           (int)((ulong)in_stack_ffffffffffffef50 >> 0x20));
  iVar18 = (int)((ulong)in_stack_ffffffffffffef58 >> 0x20);
  psVar24 = (size_t *)&stack0xffffffffffffef38;
  if (local_8c != 0) goto LAB_00125319;
  if (local_88 == 0) {
    tls->cipher_suite = (ptls_cipher_suite_t *)src;
    uStackY_10d0 = 0x11fd79;
    ppVar20 = key_schedule_new(in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
                               in_stack_ffffffffffffefe8);
    tls->key_schedule = ppVar20;
  }
  else if (tls->cipher_suite != (ptls_cipher_suite_t *)src) {
    local_8c = 0x28;
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    goto LAB_00125319;
  }
  if ((psStack_50 == (st_ptls_key_exchange_algorithm_t *)0x0) &&
     (*(long *)(key_share.peer_key.len + 0x58) != 0)) {
    end = *(uint8_t **)(key_share.peer_key.len + 0x58);
    puVar21 = end + *(long *)(key_share.peer_key.len + 0x60);
    _block_size = 2;
    if ((ulong)((long)puVar21 - (long)end) < 2) {
      local_8c = 0x32;
      psVar24 = (size_t *)&stack0xffffffffffffef38;
      goto LAB_00125319;
    }
    _block_size64 = 0;
    do {
      puVar23 = end + 1;
      _block_size64 = _block_size64 << 8 | (ulong)*end;
      _block_size = _block_size - 1;
      end = puVar23;
    } while (_block_size != 0);
    if ((ulong)((long)puVar21 - (long)puVar23) < _block_size64) {
      local_8c = 0x32;
      psVar24 = (size_t *)&stack0xffffffffffffef38;
      goto LAB_00125319;
    }
    uStackY_10d0 = 0x11ff4a;
    local_8c = select_key_share(in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,
                                (ptls_key_exchange_algorithm_t **)in_stack_ffffffffffffef70,
                                (uint8_t **)in_stack_ffffffffffffef68,in_stack_ffffffffffffef60,
                                iVar18);
    psVar24 = (size_t *)&stack0xffffffffffffef38;
    if (local_8c != 0) goto LAB_00125319;
    if (puVar23 != puVar23 + _block_size64) {
      local_8c = 0x32;
      psVar24 = (size_t *)&stack0xffffffffffffef38;
      goto LAB_00125319;
    }
    if (puVar23 != puVar21) {
      local_8c = 0x32;
      psVar24 = (size_t *)&stack0xffffffffffffef38;
      goto LAB_00125319;
    }
  }
  psVar24 = (size_t *)&stack0xffffffffffffef38;
  if (local_88 == 0) {
    if ((*(long *)(key_share.peer_key.len + 600) != 0) &&
       (psStack_50 != (st_ptls_key_exchange_algorithm_t *)0x0)) {
      sVar2 = (*tls->ctx->cipher_suites)->hash->digest_size;
      lVar11 = -(sVar2 + 0xf & 0xfffffffffffffff0);
      psVar24 = (size_t *)(&stack0xffffffffffffef38 + lVar11);
      *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120033;
      local_8c = calc_cookie_signature
                           (*(ptls_t **)(&stack0xffffffffffffefa8 + lVar11),
                            *(ptls_handshake_properties_t **)(&stack0xffffffffffffefa0 + lVar11),
                            *(ptls_key_exchange_algorithm_t **)(&stack0xffffffffffffef98 + lVar11),
                            *(ptls_iovec_t *)(&stack0xffffffffffffefb0 + lVar11),
                            *(uint8_t **)(&stack0xffffffffffffef90 + lVar11));
      if (local_8c != 0) goto LAB_00125319;
      if (*(size_t *)(key_share.peer_key.len + 0x288) == sVar2) {
        pvVar19 = *(void **)(key_share.peer_key.len + 0x280);
        *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120079;
        iVar18 = (*ptls_mem_equal)(pvVar19,psVar24,sVar2);
        if (iVar18 != 0) {
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x12009a;
          key_schedule_update_ch1hash_prefix
                    (*(ptls_key_schedule_t **)(&stack0xffffffffffffef40 + lVar11));
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x1200bd;
          ptls__key_schedule_update_hash
                    (*(ptls_key_schedule_t **)(&stack0xffffffffffffef50 + lVar11),
                     *(uint8_t **)(&stack0xffffffffffffef48 + lVar11),
                     *(size_t *)(&stack0xffffffffffffef40 + lVar11));
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x1200d8;
          ptls_iovec_init((void *)0x0,0);
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120100;
          key_schedule_extract
                    (*(ptls_key_schedule_t **)(&stack0xffffffffffffefb8 + lVar11),
                     *(ptls_iovec_t *)(&stack0xffffffffffffefc0 + lVar11));
          sVar2 = emitter->buf->off;
          p_Var3 = emitter->begin_message;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120131;
          local_8c = (*p_Var3)(emitter);
          if (local_8c != 0) goto LAB_00125319;
          ppVar4 = emitter->buf;
          ppVar20 = tls->key_schedule;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120194;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          body_start = 3;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120203;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          sVar5 = ppVar4->off;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120267;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x12028c;
          local_8c = ptls_buffer_reserve(*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                         *(size_t *)(&stack0xffffffffffffef40 + lVar11));
          if (local_8c != 0) goto LAB_00125319;
          puVar23 = emitter->buf->base;
          sVar6 = emitter->buf->off;
          puVar21 = puVar23 + sVar6;
          puVar21[0] = 0xcf;
          puVar21[1] = '!';
          puVar21[2] = 0xad;
          puVar21[3] = 't';
          puVar21[4] = 0xe5;
          puVar21[5] = 0x9a;
          puVar21[6] = 'a';
          puVar21[7] = '\x11';
          puVar21 = puVar23 + sVar6 + 8;
          puVar21[0] = 0xbe;
          puVar21[1] = '\x1d';
          puVar21[2] = 0x8c;
          puVar21[3] = '\x02';
          puVar21[4] = '\x1e';
          puVar21[5] = 'e';
          puVar21[6] = 0xb8;
          puVar21[7] = 0x91;
          puVar21 = puVar23 + sVar6 + 0x10;
          puVar21[0] = 0xc2;
          puVar21[1] = 0xa2;
          puVar21[2] = '\x11';
          puVar21[3] = '\x16';
          puVar21[4] = 'z';
          puVar21[5] = 0xbb;
          puVar21[6] = 0x8c;
          puVar21[7] = '^';
          puVar23 = puVar23 + sVar6 + 0x18;
          puVar23[0] = '\a';
          puVar23[1] = 0x9e;
          puVar23[2] = '\t';
          puVar23[3] = 0xe2;
          puVar23[4] = 200;
          puVar23[5] = 0xa8;
          puVar23[6] = '3';
          puVar23[7] = 0x9c;
          emitter->buf->off = emitter->buf->off + 0x20;
          body_start_1 = 1;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120350;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          sVar6 = emitter->buf->off;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120392;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          sVar7 = emitter->buf->off;
          for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
            emitter->buf->base[sVar6 - body_start_1] =
                 (uint8_t)(sVar7 - sVar6 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
          }
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120494;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x1204c9;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          body_start_2 = 2;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120538;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          sVar6 = emitter->buf->off;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x12059e;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          body_start_3 = 2;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x12060f;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          sVar7 = emitter->buf->off;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120679;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          sVar8 = emitter->buf->off;
          for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
            emitter->buf->base[sVar7 - body_start_3] =
                 (uint8_t)(sVar8 - sVar7 >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
          }
          if ((*(byte *)(key_share.peer_key.len + 0x290) & 1) == 0) {
            local_e08 = (st_ptls_key_exchange_algorithm_t *)0x0;
          }
          else {
            local_e08 = psStack_50;
          }
          if (local_e08 != (st_ptls_key_exchange_algorithm_t *)0x0) {
            *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x1207bf;
            local_8c = ptls_buffer__do_pushv
                                 (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                  *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
            if (local_8c != 0) goto LAB_00125319;
            body_start_4 = 2;
            *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120830;
            local_8c = ptls_buffer__do_pushv
                                 (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                  *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
            if (local_8c != 0) goto LAB_00125319;
            sVar7 = emitter->buf->off;
            *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x12089c;
            local_8c = ptls_buffer__do_pushv
                                 (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                  *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
            if (local_8c != 0) goto LAB_00125319;
            sVar8 = emitter->buf->off;
            for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
              emitter->buf->base[sVar7 - body_start_4] =
                   (uint8_t)(sVar8 - sVar7 >> (((char)body_start_4 + -1) * '\b' & 0x3fU));
            }
          }
          local_8c = 0;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x12099c;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          body_start_5 = 2;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120a0d;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          sVar7 = emitter->buf->off;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120a55;
          local_8c = ptls_buffer__do_pushv
                               (*(ptls_buffer_t **)(&stack0xffffffffffffef48 + lVar11),
                                *(void **)(&stack0xffffffffffffef40 + lVar11),*psVar24);
          if (local_8c != 0) goto LAB_00125319;
          sVar8 = emitter->buf->off;
          for (; body_start_5 != 0; body_start_5 = body_start_5 - 1) {
            emitter->buf->base[sVar7 - body_start_5] =
                 (uint8_t)(sVar8 - sVar7 >> (((char)body_start_5 + -1) * '\b' & 0x3fU));
          }
          sVar7 = emitter->buf->off;
          for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
            emitter->buf->base[sVar6 - body_start_2] =
                 (uint8_t)(sVar7 - sVar6 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
          }
          sVar6 = ppVar4->off;
          for (; body_start != 0; body_start = body_start - 1) {
            ppVar4->base[sVar5 - body_start] =
                 (uint8_t)(sVar6 - sVar5 >> (((char)body_start + -1) * '\b' & 0x3fU));
          }
          if (ppVar20 != (ptls_key_schedule_t *)0x0) {
            *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120c92;
            ptls__key_schedule_update_hash
                      (*(ptls_key_schedule_t **)(&stack0xffffffffffffef50 + lVar11),
                       *(uint8_t **)(&stack0xffffffffffffef48 + lVar11),
                       *(size_t *)(&stack0xffffffffffffef40 + lVar11));
          }
          p_Var3 = emitter->commit_message;
          *(undefined8 *)((long)&uStackY_10d0 + lVar11) = 0x120ca8;
          local_8c = (*p_Var3)(emitter);
          if (local_8c != 0) goto LAB_00125319;
          emitter->buf->off = sVar2;
          local_88 = 1;
          goto LAB_00122a52;
        }
      }
      local_8c = 0x28;
      goto LAB_00125319;
    }
    if ((psStack_50 == (st_ptls_key_exchange_algorithm_t *)0x0) ||
       ((psVar24 = (size_t *)&stack0xffffffffffffef38,
        properties != (ptls_handshake_properties_t *)0x0 &&
        (psVar24 = (size_t *)&stack0xffffffffffffef38,
        (*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0)))) {
      if (*(long *)(key_share.peer_key.len + 0x48) == 0) {
        local_8c = 0x6d;
        psVar24 = (size_t *)&stack0xffffffffffffef38;
      }
      else {
        uStackY_10d0 = 0x120d48;
        local_8c = select_negotiated_group
                             (in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
                              (uint8_t *)in_stack_ffffffffffffef78,
                              (uint8_t *)in_stack_ffffffffffffef70);
        psVar24 = (size_t *)&stack0xffffffffffffef38;
        if (local_8c == 0) {
          uStackY_10d0 = 0x120d6d;
          ptls__key_schedule_update_hash
                    (in_stack_ffffffffffffef50,(uint8_t *)in_stack_ffffffffffffef48,
                     (size_t)in_stack_ffffffffffffef40);
          if (tls->key_schedule->generation != 0) {
            uStackY_10d0 = 0x120d9b;
            __assert_fail("tls->key_schedule->generation == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0xf33,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          if ((properties == (ptls_handshake_properties_t *)0x0) ||
             ((*(byte *)((long)&properties->field_0 + 0x60) >> 1 & 1) == 0)) {
            uStackY_10d0 = 0x121fc9;
            key_schedule_transform_post_ch1hash((ptls_key_schedule_t *)in_stack_ffffffffffffef70);
            uStackY_10d0 = 0x121fe4;
            ptls_iovec_init((void *)0x0,0);
            uStackY_10d0 = 0x12200c;
            ikm.len = in_stack_ffffffffffffefc8;
            ikm.base = in_stack_ffffffffffffefc0;
            key_schedule_extract((ptls_key_schedule_t *)in_stack_ffffffffffffefb8,ikm);
            uStackY_10d0 = 0x12202b;
            local_8c = (*emitter->begin_message)(emitter);
            psVar24 = (size_t *)&stack0xffffffffffffef38;
            if (local_8c == 0) {
              ppVar4 = emitter->buf;
              ppVar20 = tls->key_schedule;
              uStackY_10d0 = 0x12208e;
              local_8c = ptls_buffer__do_pushv
                                   (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                    (size_t)in_stack_ffffffffffffef38);
              psVar24 = (size_t *)&stack0xffffffffffffef38;
              if (local_8c == 0) {
                body_start_16 = 3;
                uStackY_10d0 = 0x1220fd;
                local_8c = ptls_buffer__do_pushv
                                     (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                      (size_t)in_stack_ffffffffffffef38);
                psVar24 = (size_t *)&stack0xffffffffffffef38;
                if (local_8c == 0) {
                  sVar2 = ppVar4->off;
                  uStackY_10d0 = 0x122161;
                  local_8c = ptls_buffer__do_pushv
                                       (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                        (size_t)in_stack_ffffffffffffef38);
                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                  if (local_8c == 0) {
                    uStackY_10d0 = 0x122186;
                    local_8c = ptls_buffer_reserve(in_stack_ffffffffffffef48,
                                                   (size_t)in_stack_ffffffffffffef40);
                    psVar24 = (size_t *)&stack0xffffffffffffef38;
                    if (local_8c == 0) {
                      puVar21 = emitter->buf->base;
                      sVar5 = emitter->buf->off;
                      puVar22 = puVar21 + sVar5;
                      puVar22[0] = 0xcf;
                      puVar22[1] = '!';
                      puVar22[2] = 0xad;
                      puVar22[3] = 't';
                      puVar22[4] = 0xe5;
                      puVar22[5] = 0x9a;
                      puVar22[6] = 'a';
                      puVar22[7] = '\x11';
                      puVar22 = puVar21 + sVar5 + 8;
                      puVar22[0] = 0xbe;
                      puVar22[1] = '\x1d';
                      puVar22[2] = 0x8c;
                      puVar22[3] = '\x02';
                      puVar22[4] = '\x1e';
                      puVar22[5] = 'e';
                      puVar22[6] = 0xb8;
                      puVar22[7] = 0x91;
                      puVar22 = puVar21 + sVar5 + 0x10;
                      puVar22[0] = 0xc2;
                      puVar22[1] = 0xa2;
                      puVar22[2] = '\x11';
                      puVar22[3] = '\x16';
                      puVar22[4] = 'z';
                      puVar22[5] = 0xbb;
                      puVar22[6] = 0x8c;
                      puVar22[7] = '^';
                      puVar21 = puVar21 + sVar5 + 0x18;
                      puVar21[0] = '\a';
                      puVar21[1] = 0x9e;
                      puVar21[2] = '\t';
                      puVar21[3] = 0xe2;
                      puVar21[4] = 200;
                      puVar21[5] = 0xa8;
                      puVar21[6] = '3';
                      puVar21[7] = 0x9c;
                      emitter->buf->off = emitter->buf->off + 0x20;
                      body_start_17 = 1;
                      uStackY_10d0 = 0x12224a;
                      local_8c = ptls_buffer__do_pushv
                                           (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                            (size_t)in_stack_ffffffffffffef38);
                      psVar24 = (size_t *)&stack0xffffffffffffef38;
                      if (local_8c == 0) {
                        sVar5 = emitter->buf->off;
                        uStackY_10d0 = 0x12228c;
                        local_8c = ptls_buffer__do_pushv
                                             (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                              (size_t)in_stack_ffffffffffffef38);
                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                        if (local_8c == 0) {
                          sVar6 = emitter->buf->off;
                          for (; body_start_17 != 0; body_start_17 = body_start_17 - 1) {
                            emitter->buf->base[sVar5 - body_start_17] =
                                 (uint8_t)(sVar6 - sVar5 >>
                                          (((char)body_start_17 + -1) * '\b' & 0x3fU));
                          }
                          uStackY_10d0 = 0x12238e;
                          local_8c = ptls_buffer__do_pushv
                                               (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                                (size_t)in_stack_ffffffffffffef38);
                          psVar24 = (size_t *)&stack0xffffffffffffef38;
                          if (local_8c == 0) {
                            uStackY_10d0 = 0x1223c3;
                            local_8c = ptls_buffer__do_pushv
                                                 (in_stack_ffffffffffffef48,
                                                  in_stack_ffffffffffffef40,
                                                  (size_t)in_stack_ffffffffffffef38);
                            psVar24 = (size_t *)&stack0xffffffffffffef38;
                            if (local_8c == 0) {
                              body_start_18 = 2;
                              uStackY_10d0 = 0x122432;
                              local_8c = ptls_buffer__do_pushv
                                                   (in_stack_ffffffffffffef48,
                                                    in_stack_ffffffffffffef40,
                                                    (size_t)in_stack_ffffffffffffef38);
                              psVar24 = (size_t *)&stack0xffffffffffffef38;
                              if (local_8c == 0) {
                                sVar5 = emitter->buf->off;
                                uStackY_10d0 = 0x122498;
                                local_8c = ptls_buffer__do_pushv
                                                     (in_stack_ffffffffffffef48,
                                                      in_stack_ffffffffffffef40,
                                                      (size_t)in_stack_ffffffffffffef38);
                                psVar24 = (size_t *)&stack0xffffffffffffef38;
                                if (local_8c == 0) {
                                  body_start_19 = 2;
                                  uStackY_10d0 = 0x122509;
                                  local_8c = ptls_buffer__do_pushv
                                                       (in_stack_ffffffffffffef48,
                                                        in_stack_ffffffffffffef40,
                                                        (size_t)in_stack_ffffffffffffef38);
                                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                                  if (local_8c == 0) {
                                    sVar6 = emitter->buf->off;
                                    uStackY_10d0 = 0x122573;
                                    local_8c = ptls_buffer__do_pushv
                                                         (in_stack_ffffffffffffef48,
                                                          in_stack_ffffffffffffef40,
                                                          (size_t)in_stack_ffffffffffffef38);
                                    psVar24 = (size_t *)&stack0xffffffffffffef38;
                                    if (local_8c == 0) {
                                      sVar7 = emitter->buf->off;
                                      for (; body_start_19 != 0; body_start_19 = body_start_19 - 1)
                                      {
                                        emitter->buf->base[sVar6 - body_start_19] =
                                             (uint8_t)(sVar7 - sVar6 >>
                                                      (((char)body_start_19 + -1) * '\b' & 0x3fU));
                                      }
                                      if (psStack_50 == (st_ptls_key_exchange_algorithm_t *)0x0) {
                                        local_f38 = _emitter_1;
                                      }
                                      else {
                                        local_f38 = (ptls_message_emitter_t *)0x0;
                                      }
                                      if (local_f38 != (ptls_message_emitter_t *)0x0) {
                                        uStackY_10d0 = 0x1226ad;
                                        local_8c = ptls_buffer__do_pushv
                                                             (in_stack_ffffffffffffef48,
                                                              in_stack_ffffffffffffef40,
                                                              (size_t)in_stack_ffffffffffffef38);
                                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        if (local_8c != 0) goto LAB_00125319;
                                        body_start_20 = 2;
                                        uStackY_10d0 = 0x12271e;
                                        local_8c = ptls_buffer__do_pushv
                                                             (in_stack_ffffffffffffef48,
                                                              in_stack_ffffffffffffef40,
                                                              (size_t)in_stack_ffffffffffffef38);
                                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        if (local_8c != 0) goto LAB_00125319;
                                        sVar6 = emitter->buf->off;
                                        uStackY_10d0 = 0x12278a;
                                        local_8c = ptls_buffer__do_pushv
                                                             (in_stack_ffffffffffffef48,
                                                              in_stack_ffffffffffffef40,
                                                              (size_t)in_stack_ffffffffffffef38);
                                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        if (local_8c != 0) goto LAB_00125319;
                                        sVar7 = emitter->buf->off;
                                        for (; body_start_20 != 0; body_start_20 = body_start_20 - 1
                                            ) {
                                          emitter->buf->base[sVar6 - body_start_20] =
                                               (uint8_t)(sVar7 - sVar6 >>
                                                        (((char)body_start_20 + -1) * '\b' & 0x3fU))
                                          ;
                                        }
                                      }
                                      local_8c = 0;
                                      sVar6 = emitter->buf->off;
                                      for (; body_start_18 != 0; body_start_18 = body_start_18 - 1)
                                      {
                                        emitter->buf->base[sVar5 - body_start_18] =
                                             (uint8_t)(sVar6 - sVar5 >>
                                                      (((char)body_start_18 + -1) * '\b' & 0x3fU));
                                      }
                                      sVar5 = ppVar4->off;
                                      for (; body_start_16 != 0; body_start_16 = body_start_16 - 1)
                                      {
                                        ppVar4->base[sVar2 - body_start_16] =
                                             (uint8_t)(sVar5 - sVar2 >>
                                                      (((char)body_start_16 + -1) * '\b' & 0x3fU));
                                      }
                                      if (ppVar20 != (ptls_key_schedule_t *)0x0) {
                                        uStackY_10d0 = 0x1229cd;
                                        ptls__key_schedule_update_hash
                                                  (in_stack_ffffffffffffef50,
                                                   (uint8_t *)in_stack_ffffffffffffef48,
                                                   (size_t)in_stack_ffffffffffffef40);
                                      }
                                      uStackY_10d0 = 0x1229e3;
                                      local_8c = (*emitter->commit_message)(emitter);
                                      psVar24 = (size_t *)&stack0xffffffffffffef38;
                                      if (local_8c == 0) {
                                        uStackY_10d0 = 0x122a02;
                                        local_8c = push_change_cipher_spec
                                                             (in_stack_ffffffffffffef70,
                                                              in_stack_ffffffffffffef68);
                                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        if (local_8c == 0) {
                                          tls->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                          if ((*(byte *)(key_share.peer_key.len + 0x34c) & 1) != 0)
                                          {
                                            (tls->field_18).server.early_data_skipped_bytes = 0;
                                          }
                                          local_8c = 0x202;
                                          psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            uStackY_10d0 = 0x120dde;
            local_8c = (*emitter->begin_message)(emitter);
            psVar24 = (size_t *)&stack0xffffffffffffef38;
            if (local_8c == 0) {
              ppVar4 = emitter->buf;
              uStackY_10d0 = 0x120e3d;
              local_8c = ptls_buffer__do_pushv
                                   (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                    (size_t)in_stack_ffffffffffffef38);
              psVar24 = (size_t *)&stack0xffffffffffffef38;
              if (local_8c == 0) {
                body_start_6 = 3;
                uStackY_10d0 = 0x120eac;
                local_8c = ptls_buffer__do_pushv
                                     (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                      (size_t)in_stack_ffffffffffffef38);
                psVar24 = (size_t *)&stack0xffffffffffffef38;
                if (local_8c == 0) {
                  sVar2 = ppVar4->off;
                  uStackY_10d0 = 0x120f10;
                  local_8c = ptls_buffer__do_pushv
                                       (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                        (size_t)in_stack_ffffffffffffef38);
                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                  if (local_8c == 0) {
                    uStackY_10d0 = 0x120f35;
                    local_8c = ptls_buffer_reserve(in_stack_ffffffffffffef48,
                                                   (size_t)in_stack_ffffffffffffef40);
                    psVar24 = (size_t *)&stack0xffffffffffffef38;
                    if (local_8c == 0) {
                      puVar21 = emitter->buf->base;
                      sVar5 = emitter->buf->off;
                      puVar22 = puVar21 + sVar5;
                      puVar22[0] = 0xcf;
                      puVar22[1] = '!';
                      puVar22[2] = 0xad;
                      puVar22[3] = 't';
                      puVar22[4] = 0xe5;
                      puVar22[5] = 0x9a;
                      puVar22[6] = 'a';
                      puVar22[7] = '\x11';
                      puVar22 = puVar21 + sVar5 + 8;
                      puVar22[0] = 0xbe;
                      puVar22[1] = '\x1d';
                      puVar22[2] = 0x8c;
                      puVar22[3] = '\x02';
                      puVar22[4] = '\x1e';
                      puVar22[5] = 'e';
                      puVar22[6] = 0xb8;
                      puVar22[7] = 0x91;
                      puVar22 = puVar21 + sVar5 + 0x10;
                      puVar22[0] = 0xc2;
                      puVar22[1] = 0xa2;
                      puVar22[2] = '\x11';
                      puVar22[3] = '\x16';
                      puVar22[4] = 'z';
                      puVar22[5] = 0xbb;
                      puVar22[6] = 0x8c;
                      puVar22[7] = '^';
                      puVar21 = puVar21 + sVar5 + 0x18;
                      puVar21[0] = '\a';
                      puVar21[1] = 0x9e;
                      puVar21[2] = '\t';
                      puVar21[3] = 0xe2;
                      puVar21[4] = 200;
                      puVar21[5] = 0xa8;
                      puVar21[6] = '3';
                      puVar21[7] = 0x9c;
                      emitter->buf->off = emitter->buf->off + 0x20;
                      body_start_7 = 1;
                      uStackY_10d0 = 0x120ff9;
                      local_8c = ptls_buffer__do_pushv
                                           (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                            (size_t)in_stack_ffffffffffffef38);
                      psVar24 = (size_t *)&stack0xffffffffffffef38;
                      if (local_8c == 0) {
                        sVar5 = emitter->buf->off;
                        uStackY_10d0 = 0x12103b;
                        local_8c = ptls_buffer__do_pushv
                                             (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                              (size_t)in_stack_ffffffffffffef38);
                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                        if (local_8c == 0) {
                          sVar6 = emitter->buf->off;
                          for (; body_start_7 != 0; body_start_7 = body_start_7 - 1) {
                            emitter->buf->base[sVar5 - body_start_7] =
                                 (uint8_t)(sVar6 - sVar5 >>
                                          (((char)body_start_7 + -1) * '\b' & 0x3fU));
                          }
                          uStackY_10d0 = 0x12113d;
                          local_8c = ptls_buffer__do_pushv
                                               (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                                (size_t)in_stack_ffffffffffffef38);
                          psVar24 = (size_t *)&stack0xffffffffffffef38;
                          if (local_8c == 0) {
                            uStackY_10d0 = 0x121172;
                            local_8c = ptls_buffer__do_pushv
                                                 (in_stack_ffffffffffffef48,
                                                  in_stack_ffffffffffffef40,
                                                  (size_t)in_stack_ffffffffffffef38);
                            psVar24 = (size_t *)&stack0xffffffffffffef38;
                            if (local_8c == 0) {
                              body_start_8 = 2;
                              uStackY_10d0 = 0x1211e1;
                              local_8c = ptls_buffer__do_pushv
                                                   (in_stack_ffffffffffffef48,
                                                    in_stack_ffffffffffffef40,
                                                    (size_t)in_stack_ffffffffffffef38);
                              psVar24 = (size_t *)&stack0xffffffffffffef38;
                              if (local_8c == 0) {
                                sVar5 = emitter->buf->off;
                                uStackY_10d0 = 0x121247;
                                local_8c = ptls_buffer__do_pushv
                                                     (in_stack_ffffffffffffef48,
                                                      in_stack_ffffffffffffef40,
                                                      (size_t)in_stack_ffffffffffffef38);
                                psVar24 = (size_t *)&stack0xffffffffffffef38;
                                if (local_8c == 0) {
                                  body_start_9 = 2;
                                  uStackY_10d0 = 0x1212b8;
                                  local_8c = ptls_buffer__do_pushv
                                                       (in_stack_ffffffffffffef48,
                                                        in_stack_ffffffffffffef40,
                                                        (size_t)in_stack_ffffffffffffef38);
                                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                                  if (local_8c == 0) {
                                    sVar6 = emitter->buf->off;
                                    uStackY_10d0 = 0x121322;
                                    local_8c = ptls_buffer__do_pushv
                                                         (in_stack_ffffffffffffef48,
                                                          in_stack_ffffffffffffef40,
                                                          (size_t)in_stack_ffffffffffffef38);
                                    psVar24 = (size_t *)&stack0xffffffffffffef38;
                                    if (local_8c == 0) {
                                      sVar7 = emitter->buf->off;
                                      for (; body_start_9 != 0; body_start_9 = body_start_9 - 1) {
                                        emitter->buf->base[sVar6 - body_start_9] =
                                             (uint8_t)(sVar7 - sVar6 >>
                                                      (((char)body_start_9 + -1) * '\b' & 0x3fU));
                                      }
                                      local_8c = 0;
                                      if (psStack_50 == (st_ptls_key_exchange_algorithm_t *)0x0) {
                                        local_e70 = _emitter_1;
                                      }
                                      else {
                                        local_e70 = (ptls_message_emitter_t *)0x0;
                                      }
                                      if (local_e70 != (ptls_message_emitter_t *)0x0) {
                                        uStackY_10d0 = 0x12145c;
                                        local_8c = ptls_buffer__do_pushv
                                                             (in_stack_ffffffffffffef48,
                                                              in_stack_ffffffffffffef40,
                                                              (size_t)in_stack_ffffffffffffef38);
                                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        if (local_8c != 0) goto LAB_00125319;
                                        body_start_10 = 2;
                                        uStackY_10d0 = 0x1214cd;
                                        local_8c = ptls_buffer__do_pushv
                                                             (in_stack_ffffffffffffef48,
                                                              in_stack_ffffffffffffef40,
                                                              (size_t)in_stack_ffffffffffffef38);
                                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        if (local_8c != 0) goto LAB_00125319;
                                        sVar6 = emitter->buf->off;
                                        uStackY_10d0 = 0x121539;
                                        local_8c = ptls_buffer__do_pushv
                                                             (in_stack_ffffffffffffef48,
                                                              in_stack_ffffffffffffef40,
                                                              (size_t)in_stack_ffffffffffffef38);
                                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        if (local_8c != 0) goto LAB_00125319;
                                        sVar7 = emitter->buf->off;
                                        for (; body_start_10 != 0; body_start_10 = body_start_10 - 1
                                            ) {
                                          emitter->buf->base[sVar6 - body_start_10] =
                                               (uint8_t)(sVar7 - sVar6 >>
                                                        (((char)body_start_10 + -1) * '\b' & 0x3fU))
                                          ;
                                        }
                                      }
                                      local_8c = 0;
                                      ppVar14 = emitter->buf;
                                      uStackY_10d0 = 0x121645;
                                      local_8c = ptls_buffer__do_pushv
                                                           (in_stack_ffffffffffffef48,
                                                            in_stack_ffffffffffffef40,
                                                            (size_t)in_stack_ffffffffffffef38);
                                      psVar24 = (size_t *)&stack0xffffffffffffef38;
                                      if (local_8c == 0) {
                                        body_start_11 = 2;
                                        uStackY_10d0 = 0x1216b6;
                                        local_8c = ptls_buffer__do_pushv
                                                             (in_stack_ffffffffffffef48,
                                                              in_stack_ffffffffffffef40,
                                                              (size_t)in_stack_ffffffffffffef38);
                                        psVar24 = (size_t *)&stack0xffffffffffffef38;
                                        if (local_8c == 0) {
                                          sVar6 = ppVar14->off;
                                          body_start_12 = 2;
                                          uStackY_10d0 = 0x121737;
                                          local_8c = ptls_buffer__do_pushv
                                                               (in_stack_ffffffffffffef48,
                                                                in_stack_ffffffffffffef40,
                                                                (size_t)in_stack_ffffffffffffef38);
                                          psVar24 = (size_t *)&stack0xffffffffffffef38;
                                          if (local_8c == 0) {
                                            sVar7 = ppVar14->off;
                                            sVar8 = ppVar14->off;
                                            body_start_13 = 2;
                                            uStackY_10d0 = 0x1217c8;
                                            local_8c = ptls_buffer__do_pushv
                                                                 (in_stack_ffffffffffffef48,
                                                                  in_stack_ffffffffffffef40,
                                                                  (size_t)in_stack_ffffffffffffef38)
                                            ;
                                            psVar24 = (size_t *)&stack0xffffffffffffef38;
                                            if (local_8c == 0) {
                                              sVar17 = ppVar14->off;
                                              body_start_14 = 1;
                                              uStackY_10d0 = 0x121849;
                                              local_8c = ptls_buffer__do_pushv
                                                                   (in_stack_ffffffffffffef48,
                                                                    in_stack_ffffffffffffef40,
                                                                    (size_t)
                                                  in_stack_ffffffffffffef38);
                                              psVar24 = (size_t *)&stack0xffffffffffffef38;
                                              if (local_8c == 0) {
                                                sVar9 = ppVar14->off;
                                                sVar10 = tls->cipher_suite->hash->digest_size;
                                                uStackY_10d0 = 0x12189a;
                                                local_8c = ptls_buffer_reserve(
                                                  in_stack_ffffffffffffef48,
                                                  (size_t)in_stack_ffffffffffffef40);
                                                psVar24 = (size_t *)&stack0xffffffffffffef38;
                                                if (local_8c == 0) {
                                                  uStackY_10d0 = 0x1218cc;
                                                  key_schedule_extract_ch1hash
                                                            (in_stack_ffffffffffffef40,
                                                             in_stack_ffffffffffffef38);
                                                  ppVar14->off = sVar10 + ppVar14->off;
                                                  sVar10 = ppVar14->off;
                                                  for (; body_start_14 != 0;
                                                      body_start_14 = body_start_14 - 1) {
                                                    ppVar14->base[sVar9 - body_start_14] =
                                                         (uint8_t)(sVar10 - sVar9 >>
                                                                  (((char)body_start_14 + -1) * '\b'
                                                                  & 0x3fU));
                                                  }
                                                  uStackY_10d0 = 0x1219b1;
                                                  local_8c = ptls_buffer__do_pushv
                                                                       (in_stack_ffffffffffffef48,
                                                                        in_stack_ffffffffffffef40,
                                                                        (size_t)
                                                  in_stack_ffffffffffffef38);
                                                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                                                  if (local_8c == 0) {
                                                    sVar9 = ppVar14->off;
                                                    for (; body_start_13 != 0;
                                                        body_start_13 = body_start_13 - 1) {
                                                      ppVar14->base[sVar17 - body_start_13] =
                                                           (uint8_t)(sVar9 - sVar17 >>
                                                                    (((char)body_start_13 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    sVar17 = ppVar14->off;
                                                    body_start_15 = 1;
                                                    uStackY_10d0 = 0x121adb;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         (in_stack_ffffffffffffef48,
                                                                          in_stack_ffffffffffffef40,
                                                                          (size_t)
                                                  in_stack_ffffffffffffef38);
                                                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                                                  if (local_8c == 0) {
                                                    sVar9 = ppVar14->off;
                                                    sVar10 = (*tls->ctx->cipher_suites)->hash->
                                                             digest_size;
                                                    uStackY_10d0 = 0x121b2f;
                                                    local_8c = ptls_buffer_reserve(
                                                  in_stack_ffffffffffffef48,
                                                  (size_t)in_stack_ffffffffffffef40);
                                                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                                                  if (local_8c == 0) {
                                                    uStackY_10d0 = 0x121b80;
                                                    ptls_iovec_init(ppVar14->base + sVar8,
                                                                    sVar17 - sVar8);
                                                    uStackY_10d0 = 0x121bd1;
                                                    tbs.len = (size_t)in_stack_ffffffffffffefb8;
                                                    tbs.base = (uint8_t *)in_stack_ffffffffffffefb0;
                                                    local_8c = calc_cookie_signature
                                                                         (in_stack_ffffffffffffefa8,
                                                                          (
                                                  ptls_handshake_properties_t *)
                                                  in_stack_ffffffffffffefa0,
                                                  in_stack_ffffffffffffef98,tbs,
                                                  in_stack_ffffffffffffef90);
                                                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                                                  if (local_8c == 0) {
                                                    ppVar14->off = sVar10 + ppVar14->off;
                                                    sVar8 = ppVar14->off;
                                                    for (; body_start_15 != 0;
                                                        body_start_15 = body_start_15 - 1) {
                                                      ppVar14->base[sVar9 - body_start_15] =
                                                           (uint8_t)(sVar8 - sVar9 >>
                                                                    (((char)body_start_15 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    sVar8 = ppVar14->off;
                                                    for (; body_start_12 != 0;
                                                        body_start_12 = body_start_12 - 1) {
                                                      ppVar14->base[sVar7 - body_start_12] =
                                                           (uint8_t)(sVar8 - sVar7 >>
                                                                    (((char)body_start_12 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    sVar7 = ppVar14->off;
                                                    for (; body_start_11 != 0;
                                                        body_start_11 = body_start_11 - 1) {
                                                      ppVar14->base[sVar6 - body_start_11] =
                                                           (uint8_t)(sVar7 - sVar6 >>
                                                                    (((char)body_start_11 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    sVar6 = emitter->buf->off;
                                                    for (; body_start_8 != 0;
                                                        body_start_8 = body_start_8 - 1) {
                                                      emitter->buf->base[sVar5 - body_start_8] =
                                                           (uint8_t)(sVar6 - sVar5 >>
                                                                    (((char)body_start_8 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    sVar5 = ppVar4->off;
                                                    for (; body_start_6 != 0;
                                                        body_start_6 = body_start_6 - 1) {
                                                      ppVar4->base[sVar2 - body_start_6] =
                                                           (uint8_t)(sVar5 - sVar2 >>
                                                                    (((char)body_start_6 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    uStackY_10d0 = 0x121f7e;
                                                    local_8c = (*emitter->commit_message)(emitter);
                                                    psVar24 = (size_t *)&stack0xffffffffffffef38;
                                                    if (local_8c == 0) {
                                                      uStackY_10d0 = 0x121f9d;
                                                      local_8c = push_change_cipher_spec
                                                                           (
                                                  in_stack_ffffffffffffef70,
                                                  in_stack_ffffffffffffef68);
                                                  psVar24 = (size_t *)&stack0xffffffffffffef38;
                                                  if (local_8c == 0) {
                                                    local_8c = 0x206;
                                                    psVar24 = (size_t *)&stack0xffffffffffffef38;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00125319;
    }
  }
LAB_00122a52:
  psVar24[-1] = 0x122a6a;
  local_8c = report_unknown_extensions
                       ((ptls_t *)psVar24[2],(ptls_handshake_properties_t *)psVar24[1],
                        (ptls_raw_extension_t *)*psVar24);
  if (local_8c == 0) {
    if ((((local_88 == 0) && (*(long *)(key_share.peer_key.len + 0x298) != 0)) &&
        ((*(uint *)(key_share.peer_key.len + 0x348) & 3) != 0)) &&
       ((tls->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0 &&
        (((byte)tls->ctx->field_0x70 >> 3 & 1) == 0)))) {
      lVar11 = *(long *)(key_share.peer_key.len + 0x298);
      psVar24[-1] = 0x122b06;
      ptls_iovec_init(puVar22,lVar11 - (long)puVar22);
      psVar24[-1] = 0x122b3d;
      local_8c = try_psk_handshake((ptls_t *)psVar24[0x21],(size_t *)psVar24[0x20],
                                   (int *)psVar24[0x1f],(st_ptls_client_hello_t *)psVar24[0x1e],
                                   *(ptls_iovec_t *)(psVar24 + 0x22));
      if (local_8c != 0) goto LAB_00125319;
    }
    psVar24[-1] = 0x122b86;
    ptls__key_schedule_update_hash
              ((ptls_key_schedule_t *)psVar24[3],(uint8_t *)psVar24[2],psVar24[1]);
    if (local_88 == 0) {
      if (tls->key_schedule->generation != 0) {
        psVar24[-1] = 0x122bba;
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0xf83,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      psVar24[-1] = 0x122bd5;
      ptls_iovec_init((void *)0x0,0);
      psVar24[-1] = 0x122bfd;
      key_schedule_extract((ptls_key_schedule_t *)psVar24[0x10],*(ptls_iovec_t *)(psVar24 + 0x11));
    }
    if (properties != (ptls_handshake_properties_t *)0x0) {
      *(undefined8 *)((long)&properties->field_0 + 0x40) = 0;
    }
    if (psStack_50 == (st_ptls_key_exchange_algorithm_t *)0x0) {
      local_8c = 0x6d;
      if (*(long *)(key_share.peer_key.len + 0x58) != 0) {
        local_8c = 0x28;
      }
    }
    else {
      p_Var12 = psStack_50->exchange;
      psVar24[-1] = 0x122df2;
      local_8c = (*p_Var12)(psStack_50,(ptls_iovec_t *)&ecdh_secret.len,
                            (ptls_iovec_t *)&is_second_flight,(ptls_iovec_t)key_share._0_16_);
      if (local_8c == 0) {
        tls->key_share = psStack_50;
        local_8c = 0;
        p_Var3 = emitter->begin_message;
        psVar24[-1] = 0x122e32;
        local_8c = (*p_Var3)(emitter);
        if (local_8c == 0) {
          ppVar4 = emitter->buf;
          ppVar20 = tls->key_schedule;
          psVar24[-1] = 0x122e95;
          local_8c = ptls_buffer__do_pushv((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],*psVar24);
          if (local_8c == 0) {
            body_start_21 = 3;
            psVar24[-1] = 0x122f04;
            local_8c = ptls_buffer__do_pushv
                                 ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],*psVar24);
            if (local_8c == 0) {
              sVar2 = ppVar4->off;
              psVar24[-1] = 0x122f68;
              local_8c = ptls_buffer__do_pushv
                                   ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],*psVar24);
              if (local_8c == 0) {
                psVar24[-1] = 0x122f8d;
                local_8c = ptls_buffer_reserve((ptls_buffer_t *)psVar24[2],psVar24[1]);
                if (local_8c == 0) {
                  p_Var13 = tls->ctx->random_bytes;
                  puVar22 = emitter->buf->base;
                  sVar5 = emitter->buf->off;
                  psVar24[-1] = 0x122fc5;
                  (*p_Var13)(puVar22 + sVar5,0x20);
                  emitter->buf->off = emitter->buf->off + 0x20;
                  body_start_22 = 1;
                  psVar24[-1] = 0x123033;
                  local_8c = ptls_buffer__do_pushv
                                       ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],*psVar24);
                  if (local_8c == 0) {
                    sVar5 = emitter->buf->off;
                    psVar24[-1] = 0x123075;
                    local_8c = ptls_buffer__do_pushv
                                         ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],*psVar24);
                    if (local_8c == 0) {
                      sVar6 = emitter->buf->off;
                      for (; body_start_22 != 0; body_start_22 = body_start_22 - 1) {
                        emitter->buf->base[sVar5 - body_start_22] =
                             (uint8_t)(sVar6 - sVar5 >> (((char)body_start_22 + -1) * '\b' & 0x3fU))
                        ;
                      }
                      psVar24[-1] = 0x123177;
                      local_8c = ptls_buffer__do_pushv
                                           ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],*psVar24)
                      ;
                      if (local_8c == 0) {
                        psVar24[-1] = 0x1231ac;
                        local_8c = ptls_buffer__do_pushv
                                             ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],
                                              *psVar24);
                        if (local_8c == 0) {
                          body_start_23 = 2;
                          psVar24[-1] = 0x12321b;
                          local_8c = ptls_buffer__do_pushv
                                               ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],
                                                *psVar24);
                          if (local_8c == 0) {
                            sVar5 = emitter->buf->off;
                            psVar24[-1] = 0x123281;
                            local_8c = ptls_buffer__do_pushv
                                                 ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],
                                                  *psVar24);
                            if (local_8c == 0) {
                              body_start_24 = 2;
                              psVar24[-1] = 0x1232f2;
                              local_8c = ptls_buffer__do_pushv
                                                   ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1],
                                                    *psVar24);
                              if (local_8c == 0) {
                                sVar6 = emitter->buf->off;
                                psVar24[-1] = 0x12335c;
                                local_8c = ptls_buffer__do_pushv
                                                     ((ptls_buffer_t *)psVar24[2],(void *)psVar24[1]
                                                      ,*psVar24);
                                if (local_8c == 0) {
                                  sVar7 = emitter->buf->off;
                                  for (; body_start_24 != 0; body_start_24 = body_start_24 - 1) {
                                    emitter->buf->base[sVar6 - body_start_24] =
                                         (uint8_t)(sVar7 - sVar6 >>
                                                  (((char)body_start_24 + -1) * '\b' & 0x3fU));
                                  }
                                  ppVar14 = emitter->buf;
                                  psVar24[-1] = 0x123472;
                                  local_8c = ptls_buffer__do_pushv
                                                       ((ptls_buffer_t *)psVar24[2],
                                                        (void *)psVar24[1],*psVar24);
                                  if (local_8c == 0) {
                                    body_start_25 = 2;
                                    psVar24[-1] = 0x1234e3;
                                    local_8c = ptls_buffer__do_pushv
                                                         ((ptls_buffer_t *)psVar24[2],
                                                          (void *)psVar24[1],*psVar24);
                                    if (local_8c == 0) {
                                      sVar6 = ppVar14->off;
                                      psVar24[-1] = 0x12354c;
                                      local_8c = ptls_buffer__do_pushv
                                                           ((ptls_buffer_t *)psVar24[2],
                                                            (void *)psVar24[1],*psVar24);
                                      if (local_8c == 0) {
                                        body_start_26 = 2;
                                        psVar24[-1] = 0x1235bd;
                                        local_8c = ptls_buffer__do_pushv
                                                             ((ptls_buffer_t *)psVar24[2],
                                                              (void *)psVar24[1],*psVar24);
                                        if (local_8c == 0) {
                                          sVar7 = ppVar14->off;
                                          psVar24[-1] = 0x1235f7;
                                          local_8c = ptls_buffer__do_pushv
                                                               ((ptls_buffer_t *)psVar24[2],
                                                                (void *)psVar24[1],*psVar24);
                                          if (local_8c == 0) {
                                            sVar8 = ppVar14->off;
                                            for (; body_start_26 != 0;
                                                body_start_26 = body_start_26 - 1) {
                                              ppVar14->base[sVar7 - body_start_26] =
                                                   (uint8_t)(sVar8 - sVar7 >>
                                                            (((char)body_start_26 + -1) * '\b' &
                                                            0x3fU));
                                            }
                                            sVar7 = ppVar14->off;
                                            for (; body_start_25 != 0;
                                                body_start_25 = body_start_25 - 1) {
                                              ppVar14->base[sVar6 - body_start_25] =
                                                   (uint8_t)(sVar7 - sVar6 >>
                                                            (((char)body_start_25 + -1) * '\b' &
                                                            0x3fU));
                                            }
                                            sVar6 = emitter->buf->off;
                                            for (; body_start_23 != 0;
                                                body_start_23 = body_start_23 - 1) {
                                              emitter->buf->base[sVar5 - body_start_23] =
                                                   (uint8_t)(sVar6 - sVar5 >>
                                                            (((char)body_start_23 + -1) * '\b' &
                                                            0x3fU));
                                            }
                                            sVar5 = ppVar4->off;
                                            for (; body_start_21 != 0;
                                                body_start_21 = body_start_21 - 1) {
                                              ppVar4->base[sVar2 - body_start_21] =
                                                   (uint8_t)(sVar5 - sVar2 >>
                                                            (((char)body_start_21 + -1) * '\b' &
                                                            0x3fU));
                                            }
                                            if (ppVar20 != (ptls_key_schedule_t *)0x0) {
                                              psVar24[-1] = 0x123ab7;
                                              ptls__key_schedule_update_hash
                                                        ((ptls_key_schedule_t *)psVar24[3],
                                                         (uint8_t *)psVar24[2],psVar24[1]);
                                            }
                                            p_Var3 = emitter->commit_message;
                                            psVar24[-1] = 0x123acd;
                                            local_8c = (*p_Var3)(emitter);
                                            if (local_8c == 0) {
                                              psVar24[-1] = 0x123aec;
                                              local_8c = push_change_cipher_spec
                                                                   ((ptls_t *)psVar24[7],
                                                                    (ptls_message_emitter_t *)
                                                                    psVar24[6]);
                                              if (local_8c == 0) {
                                                if (tls->key_schedule->generation != 1) {
                                                  psVar24[-1] = 0x123b2a;
                                                  __assert_fail("tls->key_schedule->generation == 1"
                                                                ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                                  ,0xfc3,
                                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                                  );
                                                }
                                                psVar24[-1] = 0x123b3f;
                                                key_schedule_extract
                                                          ((ptls_key_schedule_t *)psVar24[0x10],
                                                           *(ptls_iovec_t *)(psVar24 + 0x11));
                                                psVar24[-1] = 0x123b5c;
                                                local_8c = setup_traffic_protection
                                                                     ((ptls_t *)psVar24[10],
                                                                      *(int *)((long)psVar24 + 0x4c)
                                                                      ,(char *)psVar24[8],psVar24[7]
                                                                      ,*(int *)((long)psVar24 + 0x34
                                                                               ));
                                                if (local_8c == 0) {
                                                  if (tls->pending_handshake_secret ==
                                                      (uint8_t *)0x0) {
                                                    psVar24[-1] = 0x123c22;
                                                    local_8c = setup_traffic_protection
                                                                         ((ptls_t *)psVar24[10],
                                                                          *(int *)((long)psVar24 +
                                                                                  0x4c),
                                                                          (char *)psVar24[8],
                                                                          psVar24[7],
                                                                          *(int *)((long)psVar24 +
                                                                                  0x34));
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    if ((*(byte *)(key_share.peer_key.len + 0x34c) &
                                                        1) != 0) {
                                                      (tls->field_18).server.
                                                      early_data_skipped_bytes = 0;
                                                    }
                                                    iVar18 = 0;
                                                  }
                                                  else {
                                                    psVar24[-1] = 0x123b9d;
                                                    local_8c = derive_secret((ptls_key_schedule_t *)
                                                                             psVar24[0xb],
                                                                             (void *)psVar24[10],
                                                                             (char *)psVar24[9]);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    iVar18 = 0;
                                                    if (tls->ctx->update_traffic_key !=
                                                        (ptls_update_traffic_key_t *)0x0) {
                                                      p_Var15 = tls->ctx->update_traffic_key->cb;
                                                      psVar16 = tls->ctx->update_traffic_key;
                                                      puVar22 = tls->pending_handshake_secret;
                                                      psVar24[-1] = 0x123bf5;
                                                      local_8c = (*p_Var15)(psVar16,tls,0,2,puVar22)
                                                      ;
                                                      iVar18 = local_8c;
                                                      if (local_8c != 0) goto LAB_00125319;
                                                    }
                                                  }
                                                  local_8c = iVar18;
                                                  p_Var3 = emitter->begin_message;
                                                  psVar24[-1] = 0x123c77;
                                                  local_8c = (*p_Var3)(emitter);
                                                  if (local_8c == 0) {
                                                    ppVar4 = emitter->buf;
                                                    ppVar20 = tls->key_schedule;
                                                    psVar24[-1] = 0x123cda;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c == 0) {
                                                      body_start_28 = 3;
                                                      psVar24[-1] = 0x123d49;
                                                      local_8c = ptls_buffer__do_pushv
                                                                           ((ptls_buffer_t *)
                                                                            psVar24[2],
                                                                            (void *)psVar24[1],
                                                                            *psVar24);
                                                      if (local_8c == 0) {
                                                        sVar2 = ppVar4->off;
                                                        ppVar14 = emitter->buf;
                                                        body_start_29 = 2;
                                                        psVar24[-1] = 0x123dd6;
                                                        local_8c = ptls_buffer__do_pushv
                                                                             ((ptls_buffer_t *)
                                                                              psVar24[2],
                                                                              (void *)psVar24[1],
                                                                              *psVar24);
                                                        if (local_8c == 0) {
                                                          sVar5 = ppVar14->off;
                                                          if (tls->esni == (ptls_esni_secret_t *)0x0
                                                             ) {
                                                            if (tls->server_name != (char *)0x0) {
                                                              psVar24[-1] = 0x12405c;
                                                              local_8c = ptls_buffer__do_pushv
                                                                                   ((ptls_buffer_t *
                                                                                    )psVar24[2],
                                                                                    (void *)psVar24[
                                                  1],*psVar24);
                                                  if (local_8c != 0) goto LAB_00125319;
                                                  body_start_31 = 2;
                                                  psVar24[-1] = 0x1240cd;
                                                  local_8c = ptls_buffer__do_pushv
                                                                       ((ptls_buffer_t *)psVar24[2],
                                                                        (void *)psVar24[1],*psVar24)
                                                  ;
                                                  if (local_8c != 0) goto LAB_00125319;
                                                  sVar6 = ppVar14->off;
                                                  sVar7 = ppVar14->off;
                                                  for (; body_start_31 != 0;
                                                      body_start_31 = body_start_31 - 1) {
                                                    ppVar14->base[sVar6 - body_start_31] =
                                                         (uint8_t)(sVar7 - sVar6 >>
                                                                  (((char)body_start_31 + -1) * '\b'
                                                                  & 0x3fU));
                                                  }
                                                  local_8c = 0;
                                                  }
                                                  }
                                                  else {
                                                    psVar24[-1] = 0x123e4e;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    body_start_30 = 2;
                                                    psVar24[-1] = 0x123ebf;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar6 = ppVar14->off;
                                                    psVar24[-1] = 0x123f02;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    psVar24[-1] = 0x123f36;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar7 = ppVar14->off;
                                                    for (; body_start_30 != 0;
                                                        body_start_30 = body_start_30 - 1) {
                                                      ppVar14->base[sVar6 - body_start_30] =
                                                           (uint8_t)(sVar7 - sVar6 >>
                                                                    (((char)body_start_30 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    psVar24[-1] = 0x124003;
                                                    free_esni_secret((ptls_esni_secret_t **)
                                                                     psVar24[1],
                                                                     *(int *)((long)psVar24 + 4));
                                                  }
                                                  if (((byte)tls->ctx->field_0x70 >> 5 & 1) != 0) {
                                                    psVar24[-1] = 0x1241f8;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    body_start_32 = 2;
                                                    psVar24[-1] = 0x124269;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar6 = ppVar14->off;
                                                    psVar24[-1] = 0x1242ae;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar7 = ppVar14->off;
                                                    for (; body_start_32 != 0;
                                                        body_start_32 = body_start_32 - 1) {
                                                      ppVar14->base[sVar6 - body_start_32] =
                                                           (uint8_t)(sVar7 - sVar6 >>
                                                                    (((char)body_start_32 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    local_8c = 0;
                                                  }
                                                  if (tls->negotiated_protocol != (char *)0x0) {
                                                    psVar24[-1] = 0x1243bc;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    body_start_33 = 2;
                                                    psVar24[-1] = 0x12442d;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar6 = ppVar14->off;
                                                    body_start_34 = 2;
                                                    psVar24[-1] = 0x1244ae;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar7 = ppVar14->off;
                                                    body_start_35 = 1;
                                                    psVar24[-1] = 0x12452f;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar8 = ppVar14->off;
                                                    __s = tls->negotiated_protocol;
                                                    psVar24[-1] = 0x124585;
                                                    strlen(__s);
                                                    psVar24[-1] = 0x12459b;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar17 = ppVar14->off;
                                                    for (; body_start_35 != 0;
                                                        body_start_35 = body_start_35 - 1) {
                                                      ppVar14->base[sVar8 - body_start_35] =
                                                           (uint8_t)(sVar17 - sVar8 >>
                                                                    (((char)body_start_35 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    sVar8 = ppVar14->off;
                                                    for (; body_start_34 != 0;
                                                        body_start_34 = body_start_34 - 1) {
                                                      ppVar14->base[sVar7 - body_start_34] =
                                                           (uint8_t)(sVar8 - sVar7 >>
                                                                    (((char)body_start_34 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    sVar7 = ppVar14->off;
                                                    for (; body_start_33 != 0;
                                                        body_start_33 = body_start_33 - 1) {
                                                      ppVar14->base[sVar6 - body_start_33] =
                                                           (uint8_t)(sVar7 - sVar6 >>
                                                                    (((char)body_start_33 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    local_8c = 0;
                                                  }
                                                  if (tls->pending_handshake_secret !=
                                                      (uint8_t *)0x0) {
                                                    psVar24[-1] = 0x1247f1;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    body_start_36 = 2;
                                                    psVar24[-1] = 0x124862;
                                                    local_8c = ptls_buffer__do_pushv
                                                                         ((ptls_buffer_t *)
                                                                          psVar24[2],
                                                                          (void *)psVar24[1],
                                                                          *psVar24);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    sVar6 = ppVar14->off;
                                                    sVar7 = ppVar14->off;
                                                    for (; body_start_36 != 0;
                                                        body_start_36 = body_start_36 - 1) {
                                                      ppVar14->base[sVar6 - body_start_36] =
                                                           (uint8_t)(sVar7 - sVar6 >>
                                                                    (((char)body_start_36 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    local_8c = 0;
                                                  }
                                                  psVar24[-1] = 0x12493e;
                                                  local_8c = push_additional_extensions
                                                                       ((ptls_handshake_properties_t
                                                                         *)psVar24[9],
                                                                        (ptls_buffer_t *)psVar24[8])
                                                  ;
                                                  if (local_8c == 0) {
                                                    sVar6 = ppVar14->off;
                                                    for (; body_start_29 != 0;
                                                        body_start_29 = body_start_29 - 1) {
                                                      ppVar14->base[sVar5 - body_start_29] =
                                                           (uint8_t)(sVar6 - sVar5 >>
                                                                    (((char)body_start_29 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    sVar5 = ppVar4->off;
                                                    for (; body_start_28 != 0;
                                                        body_start_28 = body_start_28 - 1) {
                                                      ppVar4->base[sVar2 - body_start_28] =
                                                           (uint8_t)(sVar5 - sVar2 >>
                                                                    (((char)body_start_28 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    if (ppVar20 != (ptls_key_schedule_t *)0x0) {
                                                      psVar24[-1] = 0x124acf;
                                                      ptls__key_schedule_update_hash
                                                                ((ptls_key_schedule_t *)psVar24[3],
                                                                 (uint8_t *)psVar24[2],psVar24[1]);
                                                    }
                                                    p_Var3 = emitter->commit_message;
                                                    psVar24[-1] = 0x124ae5;
                                                    local_8c = (*p_Var3)(emitter);
                                                    if (local_8c == 0) {
                                                      if (((byte)tls->ctx->field_0x70 >> 3 & 1) != 0
                                                         ) {
                                                        p_Var3 = emitter->begin_message;
                                                        psVar24[-1] = 0x124b3d;
                                                        local_8c = (*p_Var3)(emitter);
                                                        if (local_8c != 0) goto LAB_00125319;
                                                        ppVar4 = emitter->buf;
                                                        ppVar20 = tls->key_schedule;
                                                        psVar24[-1] = 0x124ba0;
                                                        local_8c = ptls_buffer__do_pushv
                                                                             ((ptls_buffer_t *)
                                                                              psVar24[2],
                                                                              (void *)psVar24[1],
                                                                              *psVar24);
                                                        if (local_8c != 0) goto LAB_00125319;
                                                        body_start_37 = 3;
                                                        psVar24[-1] = 0x124c0f;
                                                        local_8c = ptls_buffer__do_pushv
                                                                             ((ptls_buffer_t *)
                                                                              psVar24[2],
                                                                              (void *)psVar24[1],
                                                                              *psVar24);
                                                        if (local_8c != 0) goto LAB_00125319;
                                                        sVar2 = ppVar4->off;
                                                        ppVar14 = emitter->buf;
                                                        psVar24[-1] = 0x124c60;
                                                        local_8c = ptls_buffer__do_pushv
                                                                             ((ptls_buffer_t *)
                                                                              psVar24[2],
                                                                              (void *)psVar24[1],
                                                                              *psVar24);
                                                        if (local_8c != 0) goto LAB_00125319;
                                                        body_start_38 = 2;
                                                        psVar24[-1] = 0x124ccf;
                                                        local_8c = ptls_buffer__do_pushv
                                                                             ((ptls_buffer_t *)
                                                                              psVar24[2],
                                                                              (void *)psVar24[1],
                                                                              *psVar24);
                                                        if (local_8c != 0) goto LAB_00125319;
                                                        sVar5 = ppVar14->off;
                                                        psVar24[-1] = 0x124d35;
                                                        local_8c = ptls_buffer__do_pushv
                                                                             ((ptls_buffer_t *)
                                                                              psVar24[2],
                                                                              (void *)psVar24[1],
                                                                              *psVar24);
                                                        if (local_8c != 0) goto LAB_00125319;
                                                        body_start_39 = 2;
                                                        psVar24[-1] = 0x124da6;
                                                        local_8c = ptls_buffer__do_pushv
                                                                             ((ptls_buffer_t *)
                                                                              psVar24[2],
                                                                              (void *)psVar24[1],
                                                                              *psVar24);
                                                        if (local_8c != 0) goto LAB_00125319;
                                                        sVar6 = ppVar14->off;
                                                        psVar24[-1] = 0x124de1;
                                                        local_8c = push_signature_algorithms
                                                                             ((
                                                  ptls_verify_certificate_t *)psVar24[9],
                                                  (ptls_buffer_t *)psVar24[8]);
                                                  if (local_8c != 0) goto LAB_00125319;
                                                  sVar7 = ppVar14->off;
                                                  for (; body_start_39 != 0;
                                                      body_start_39 = body_start_39 - 1) {
                                                    ppVar14->base[sVar6 - body_start_39] =
                                                         (uint8_t)(sVar7 - sVar6 >>
                                                                  (((char)body_start_39 + -1) * '\b'
                                                                  & 0x3fU));
                                                  }
                                                  sVar6 = ppVar14->off;
                                                  for (; body_start_38 != 0;
                                                      body_start_38 = body_start_38 - 1) {
                                                    ppVar14->base[sVar5 - body_start_38] =
                                                         (uint8_t)(sVar6 - sVar5 >>
                                                                  (((char)body_start_38 + -1) * '\b'
                                                                  & 0x3fU));
                                                  }
                                                  sVar5 = ppVar4->off;
                                                  for (; body_start_37 != 0;
                                                      body_start_37 = body_start_37 - 1) {
                                                    ppVar4->base[sVar2 - body_start_37] =
                                                         (uint8_t)(sVar5 - sVar2 >>
                                                                  (((char)body_start_37 + -1) * '\b'
                                                                  & 0x3fU));
                                                  }
                                                  if (ppVar20 != (ptls_key_schedule_t *)0x0) {
                                                    psVar24[-1] = 0x125018;
                                                    ptls__key_schedule_update_hash
                                                              ((ptls_key_schedule_t *)psVar24[3],
                                                               (uint8_t *)psVar24[2],psVar24[1]);
                                                  }
                                                  p_Var3 = emitter->commit_message;
                                                  psVar24[-1] = 0x12502e;
                                                  local_8c = (*p_Var3)(emitter);
                                                  if (local_8c != 0) goto LAB_00125319;
                                                  local_8c = 0;
                                                  }
                                                  psVar24[-1] = 0x125081;
                                                  ptls_iovec_init((void *)0x0,0);
                                                  sVar2 = *(size_t *)
                                                           (key_share.peer_key.len + 0x200);
                                                  *(uint *)(psVar24 + -4) =
                                                       (uint)(*(byte *)(key_share.peer_key.len +
                                                                       0x4f8) & 1);
                                                  psVar24[-3] = key_share.peer_key.len + 0x1e0;
                                                  psVar24[-2] = sVar2;
                                                  psVar24[-5] = 0x1250fc;
                                                  local_8c = send_certificate_and_certificate_verify
                                                                       ((ptls_t *)psVar24[0x3c],
                                                                        (ptls_message_emitter_t *)
                                                                        psVar24[0x3b],
                                                                        (
                                                  st_ptls_signature_algorithms_t *)psVar24[0x3a],
                                                  *(ptls_iovec_t *)(psVar24 + 0x3d),
                                                  (char *)psVar24[0x39],(int)psVar24[0x41],
                                                  (uint16_t *)psVar24[0x42],psVar24[0x43]);
                                                  if (local_8c == 0) {
                                                    psVar24[-1] = 0x125123;
                                                    local_8c = send_finished((ptls_t *)psVar24[0xb],
                                                                             (ptls_message_emitter_t
                                                                              *)psVar24[10]);
                                                    if (local_8c == 0) {
                                                      if (tls->key_schedule->generation != 2) {
                                                        psVar24[-1] = 0x125161;
                                                        __assert_fail(
                                                  "tls->key_schedule->generation == 2",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                                  ,0x101d,
                                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                                  );
                                                  }
                                                  psVar24[-1] = 0x12517c;
                                                  ptls_iovec_init((void *)0x0,0);
                                                  psVar24[-1] = 0x1251a4;
                                                  local_8c = key_schedule_extract
                                                                       ((ptls_key_schedule_t *)
                                                                        psVar24[0x10],
                                                                        *(ptls_iovec_t *)
                                                                         (psVar24 + 0x11));
                                                  if (local_8c == 0) {
                                                    psVar24[-1] = 0x1251d1;
                                                    local_8c = setup_traffic_protection
                                                                         ((ptls_t *)psVar24[10],
                                                                          *(int *)((long)psVar24 +
                                                                                  0x4c),
                                                                          (char *)psVar24[8],
                                                                          psVar24[7],
                                                                          *(int *)((long)psVar24 +
                                                                                  0x34));
                                                    if (local_8c == 0) {
                                                      psVar24[-1] = 0x125200;
                                                      local_8c = derive_secret((ptls_key_schedule_t
                                                                                *)psVar24[0xb],
                                                                               (void *)psVar24[10],
                                                                               (char *)psVar24[9]);
                                                      if (local_8c == 0) {
                                                        psVar24[-1] = 0x12521b;
                                                        local_8c = derive_exporter_secret
                                                                             ((ptls_t *)psVar24[6],
                                                                              *(int *)((long)psVar24
                                                                                      + 0x2c));
                                                        if (local_8c == 0) {
                                                          if (tls->pending_handshake_secret ==
                                                              (uint8_t *)0x0) {
                                                            if (((byte)tls->ctx->field_0x70 >> 3 & 1
                                                                ) == 0) {
                                                              tls->state = 
                                                  PTLS_STATE_SERVER_EXPECT_FINISHED;
                                                  }
                                                  else {
                                                    tls->state = 
                                                  PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
                                                  }
                                                  }
                                                  else if (((byte)tls->ctx->field_0x70 >> 4 & 1) ==
                                                           0) {
                                                    tls->state = 
                                                  PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
                                                  }
                                                  else {
                                                    psVar24[-1] = 0x125259;
                                                    local_8c = commission_handshake_secret
                                                                         ((ptls_t *)psVar24[1]);
                                                    if (local_8c != 0) goto LAB_00125319;
                                                    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
                                                  }
                                                  if ((*(int *)(key_share.peer_key.len + 0x348) != 0
                                                      ) && (tls->ctx->ticket_lifetime != 0)) {
                                                    psVar24[-1] = 0x1252db;
                                                    local_8c = send_session_ticket((ptls_t *)
                                                                                   psVar24[0x5e],
                                                                                   (
                                                  ptls_message_emitter_t *)psVar24[0x5d]);
                                                  if (local_8c != 0) goto LAB_00125319;
                                                  }
                                                  if (((byte)tls->ctx->field_0x70 >> 3 & 1) == 0) {
                                                    local_8c = 0;
                                                  }
                                                  else {
                                                    local_8c = 0x202;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00125319:
  psVar24[-1] = 0x125322;
  free((void *)ecdh_secret.len);
  if (_is_second_flight != (uint8_t *)0x0) {
    psVar24[-1] = 0x12533a;
    (*ptls_clear_memory)(_is_second_flight,(size_t)ecdh_secret.base);
    psVar24[-1] = 0x125343;
    free(_is_second_flight);
  }
  psVar24[-1] = 0x12534c;
  free((void *)key_share.peer_key.len);
  return local_8c;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch->legacy_session_id.base, ch->legacy_session_id.len); });       \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch->selected_version); });                                    \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }